

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall kj::parse::anon_unknown_0::TestCase505::run(TestCase505 *this)

{
  return;
}

Assistant:

TEST(CommonParsers, EndOfInput) {
  auto parser = endOfInput;

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    EXPECT_TRUE(parser(input) == nullptr);
    EXPECT_TRUE(parser(input) == nullptr);
    input.next();
    EXPECT_FALSE(parser(input) == nullptr);
  }
}